

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fctkern__final(fctkern_t *nk)

{
  fct_nlist_on_del_t in_RDI;
  
  if (in_RDI != (fct_nlist_on_del_t)0x0) {
    fct_clp__final((fct_clp_t *)0x103a8b);
    fct_nlist__final((fct_nlist_t *)nk,in_RDI);
    fct_nlist__final((fct_nlist_t *)nk,in_RDI);
    fct_nlist__final((fct_nlist_t *)nk,in_RDI);
  }
  return;
}

Assistant:

static void
fctkern__final(fctkern_t *nk)
{
    if ( nk == NULL )
    {
        return;
    }
    fct_clp__final(&(nk->cl_parser));
    fct_nlist__final(&(nk->logger_list), (fct_nlist_on_del_t)fct_logger__del);
    /* The prefix list is a list of malloc'd strings. */
    fct_nlist__final(&(nk->prefix_list), (fct_nlist_on_del_t)free);
    fct_nlist__final(&(nk->ts_list), (fct_nlist_on_del_t)fct_ts__del);
}